

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase383::run(TestCase383 *this)

{
  undefined1 node [8];
  undefined8 uVar1;
  int *piVar2;
  long *plVar3;
  AsyncIoStream *pAVar4;
  ClientHook *pCVar5;
  size_t sVar6;
  RequestHook *pRVar7;
  TwoPartyVatNetworkBase TVar8;
  Connection CVar9;
  ArrayDisposer *pAVar10;
  int __flags;
  undefined8 *puVar11;
  char *pcVar12;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  long lVar13;
  bool bVar14;
  Own<capnp::ClientHook,_std::nullptr_t> OVar15;
  Client CVar16;
  int callCount;
  Promise<void> listenPromise;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  Own<kj::AsyncIoStream,_std::nullptr_t> connection;
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_1;
  AsyncIoContext ioContext;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  TwoPartyServer server;
  TwoPartyClient client;
  undefined *puVar17;
  undefined8 uVar18;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> local_628;
  ArrayDisposer *pAStack_620;
  undefined1 local_614 [4];
  undefined1 local_610 [8];
  DebugComparison<int,_int_&> local_608;
  int local_5e0;
  undefined8 *local_5d8;
  long *local_5d0;
  char *local_5c0;
  long *local_5b8;
  OwnPromiseNode local_5b0;
  AsyncIoStream *local_5a8;
  Client local_5a0;
  undefined1 local_590 [32];
  size_t sStack_570;
  bool local_568;
  undefined7 uStack_567;
  undefined1 local_560 [16];
  long *plStack_550;
  Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_> local_548;
  undefined8 *local_530;
  long *local_528;
  undefined8 *local_520;
  long *local_518;
  undefined1 local_500 [48];
  RequestHook *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined *puStack_4b8;
  void *local_4b0;
  char *local_4a8;
  undefined *puStack_4a0;
  void *local_498;
  char *local_490;
  undefined *puStack_488;
  void *local_480;
  char *local_478;
  undefined *puStack_470;
  void *local_468;
  ArrayPtr<const_char> local_460;
  TwoPartyServer local_450;
  PointerReader local_3e8;
  Maybe<capnp::MessageSize> local_3c0;
  TwoPartyClient local_3a8;
  
  kj::setupAsyncIo();
  local_614 = (undefined1  [4])0x0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)(local_610 + 8),(int *)local_614);
  local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase =
       (VatNetworkBase)(VatNetworkBase)local_608._0_8_;
  local_3a8.network.super_Connection.super_Connection._vptr_Connection =
       (Connection)((long)local_608.right + 0x18);
  if (local_608.right == (int *)0x0) {
    local_3a8.network.super_Connection.super_Connection._vptr_Connection =
         (Connection)(_func_int **)0x0;
  }
  local_608.right = (int *)0x0;
  OVar15 = Capability::Client::makeLocalClient
                     (&local_5a0,(Own<capnp::Capability::Server,_std::nullptr_t> *)&local_3a8);
  CVar9.super_Connection._vptr_Connection =
       local_3a8.network.super_Connection.super_Connection._vptr_Connection;
  if (local_3a8.network.super_Connection.super_Connection._vptr_Connection != (_func_int **)0x0) {
    local_3a8.network.super_Connection.super_Connection._vptr_Connection =
         (Connection)(_func_int **)0x0;
    (**(code **)*(_func_int **)
                 local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
                 _vptr_VatNetworkBase)
              (local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
               _vptr_VatNetworkBase,
               (_func_int *)
               ((long)(_func_int ***)CVar9.super_Connection._vptr_Connection +
               (long)(*(_func_int ***)CVar9.super_Connection._vptr_Connection)[-2]),OVar15.ptr);
  }
  local_548.ptr.isSet = false;
  TwoPartyServer::TwoPartyServer(&local_450,&local_5a0,&local_548);
  uVar1 = local_548.ptr.field_1.value.impl.ptr;
  if ((local_548.ptr.isSet == true) && (local_548.ptr.field_1.value.impl.ptr != (Iface *)0x0)) {
    local_548.ptr.field_1.value.impl.ptr = (Iface *)0x0;
    (**(local_548.ptr.field_1.value.impl.disposer)->_vptr_Disposer)
              (local_548.ptr.field_1.value.impl.disposer,
               (_func_int *)
               ((long)&((Iface *)uVar1)->_vptr_Iface + (long)((Iface *)uVar1)->_vptr_Iface[-2]));
  }
  pCVar5 = local_5a0.hook.ptr;
  if (local_5a0.hook.ptr != (ClientHook *)0x0) {
    local_5a0.hook.ptr = (ClientHook *)0x0;
    (**(local_5a0.hook.disposer)->_vptr_Disposer)
              (local_5a0.hook.disposer,
               (_func_int *)((long)&pCVar5->_vptr_ClientHook + (long)pCVar5->_vptr_ClientHook[-2]));
  }
  piVar2 = local_608.right;
  if ((long *)local_608.right != (long *)0x0) {
    local_608.right = (int *)0x0;
    (***(_func_int ***)local_608._0_8_)
              (local_608._0_8_,(long)piVar2 + *(long *)(*(long *)piVar2 + -0x10));
  }
  puVar11 = (undefined8 *)(**(code **)(*local_518 + 0x18))();
  (**(code **)*puVar11)(&local_3a8,puVar11,"127.0.0.1",10,0);
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_470 = &DAT_004d6248;
  local_468 = (void *)0x1200000185;
  kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait(&local_628,&local_3a8);
  TVar8.super_VatNetworkBase._vptr_VatNetworkBase =
       local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase;
  if (local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase !=
      (_func_int **)0x0) {
    local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase =
         (VatNetworkBase)(_func_int **)0x0;
    kj::_::PromiseDisposer::dispose
              ((PromiseArenaMember *)TVar8.super_VatNetworkBase._vptr_VatNetworkBase);
  }
  (**(code **)(*(long *)pAStack_620 + 0x10))(&local_5c0);
  TwoPartyServer::listen((TwoPartyServer *)(local_614 + 4),(int)&local_450,(int)local_5b8);
  puVar11 = (undefined8 *)(**(code **)(*local_518 + 0x18))();
  __flags = (**(code **)(*local_5b8 + 0x10))();
  pcVar12 = (char *)0xa;
  (**(code **)*puVar11)(local_610 + 8,puVar11,"127.0.0.1");
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_488 = &DAT_004d6248;
  local_480 = (void *)0xd0000018b;
  kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&local_3a8,local_610 + 8);
  puVar11 = (undefined8 *)
            CONCAT44(local_628.super_PromiseBase.node.ptr._4_4_,
                     local_628.super_PromiseBase.node.ptr._0_4_);
  local_628.super_PromiseBase.node.ptr._0_4_ =
       local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase.
       _0_4_;
  local_628.super_PromiseBase.node.ptr._4_4_ =
       local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase.
       _4_4_;
  pAVar10 = (ArrayDisposer *)local_3a8.network.super_Connection.super_Connection._vptr_Connection;
  local_3a8.network.super_Connection.super_Connection._vptr_Connection =
       (Connection)(_func_int **)0x0;
  if (pAStack_620 != (ArrayDisposer *)0x0) {
    lVar13 = (long)pAStack_620 + *(long *)(*(long *)pAStack_620 + -0x10);
    pAStack_620 = pAVar10;
    (**(code **)*puVar11)(puVar11,lVar13);
    CVar9.super_Connection._vptr_Connection =
         (Connection)(Connection)local_3a8.network.super_Connection;
    pAVar10 = pAStack_620;
    if (local_3a8.network.super_Connection.super_Connection._vptr_Connection != (_func_int **)0x0) {
      local_3a8.network.super_Connection.super_Connection._vptr_Connection =
           (Connection)(_func_int **)0x0;
      (*(code *)**(undefined8 **)
                  local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
                  _vptr_VatNetworkBase)
                (local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase.
                 _vptr_VatNetworkBase,
                 (_func_int *)
                 ((long)(_func_int ***)CVar9.super_Connection._vptr_Connection +
                 (long)(*(_func_int ***)CVar9.super_Connection._vptr_Connection)[-2]));
      pAVar10 = pAStack_620;
    }
  }
  pAStack_620 = pAVar10;
  uVar1 = local_608._0_8_;
  if ((PromiseArenaMember *)local_608._0_8_ != (PromiseArenaMember *)0x0) {
    local_608._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  (**pAStack_620->_vptr_ArrayDisposer)(&local_3a8);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_4a0 = &DAT_004d6248;
  local_498 = (void *)0x150000018e;
  kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_5b0,&local_3a8);
  TVar8.super_VatNetworkBase._vptr_VatNetworkBase =
       (VatNetworkBase)(VatNetworkBase)local_3a8.network.super_TwoPartyVatNetworkBase;
  if (local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase !=
      (_func_int **)0x0) {
    local_3a8.network.super_TwoPartyVatNetworkBase.super_VatNetworkBase._vptr_VatNetworkBase =
         (VatNetworkBase)(_func_int **)0x0;
    kj::_::PromiseDisposer::dispose
              ((PromiseArenaMember *)TVar8.super_VatNetworkBase._vptr_VatNetworkBase);
  }
  TwoPartyClient::TwoPartyClient(&local_3a8,local_5a8);
  CVar16 = TwoPartyClient::bootstrap((TwoPartyClient *)local_500);
  (**(code **)(*(_func_int **)local_500._8_8_ + 0x20))
            (local_610 + 8,local_500._8_8_,CVar16.hook.ptr);
  uVar1 = local_500._8_8_;
  local_560._8_4_ = local_608.left;
  local_560._12_4_ = local_608._4_4_;
  plStack_550 = (long *)local_608.right;
  local_560._0_8_ = &Capability::Client::typeinfo;
  if ((_func_int **)local_500._8_8_ != (_func_int **)0x0) {
    local_500._8_8_ = (_func_int **)0x0;
    (**(code **)*(_func_int **)local_500._0_8_)
              (local_500._0_8_,uVar1 + *(long *)(*(_func_int **)uVar1 + -0x10));
  }
  local_3c0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_500,(Client *)local_560,&local_3c0);
  *(undefined4 *)local_500._16_8_ = 0x7b;
  *(byte *)(local_500._16_8_ + 4) = *(byte *)(local_500._16_8_ + 4) | 1;
  local_608.result = local_614 == (undefined1  [4])0x0;
  local_608._0_8_ = local_608._0_8_ & 0xffffffff00000000;
  local_608.op.content.ptr = " == ";
  local_608.op.content.size_ = (size_t)&DAT_00000005;
  __buf = extraout_RDX;
  local_608.right = (int *)local_614;
  if ((!local_608.result) && (kj::_::Debug::minSeverity < 3)) {
    local_590._0_8_ = local_590._0_8_ & 0xffffffff00000000;
    pcVar12 = "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount";
    __flags = 0x4d6291;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x195,ERROR,
               "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",
               (DebugComparison<int,_int_&> *)(local_610 + 8),(int *)local_590,(int *)local_614);
    __buf = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_590,(int)local_500,__buf,(size_t)pcVar12,__flags);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_4b8 = &DAT_004d6248;
  local_4b0 = (void *)0x1300000196;
  uVar18 = 0x1300000196;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puVar17 = &DAT_004d6248;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             (local_610 + 8),local_590);
  sVar6 = sStack_570;
  uVar1 = local_590._24_8_;
  if ((WirePointer *)local_590._24_8_ != (WirePointer *)0x0) {
    local_590._24_8_ = (WirePointer *)0x0;
    sStack_570 = 0;
    (*(code *)**(undefined8 **)CONCAT71(uStack_567,local_568))
              ((undefined8 *)CONCAT71(uStack_567,local_568),uVar1,8,sVar6,sVar6,0,pcVar12,puVar17,
               uVar18);
  }
  if ((char *)local_590._16_8_ != (char *)0x0) {
    local_590._16_8_ = (char *)0x0;
    (**((CapTableReader *)local_590._8_8_)->_vptr_CapTableReader)();
  }
  uVar1 = local_590._0_8_;
  if ((SegmentBuilder *)local_590._0_8_ != (SegmentBuilder *)0x0) {
    local_590._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  local_4c8 = "foo";
  bVar14 = local_608._36_2_ == 0;
  local_3e8.pointer = (WirePointer *)local_608.op.content.size_;
  if (bVar14) {
    local_3e8.pointer = (WirePointer *)0x0;
  }
  local_3e8.nestingLimit = 0x7fffffff;
  if (!bVar14) {
    local_3e8.nestingLimit = local_5e0;
  }
  local_3e8.segment._0_4_ = 0;
  local_3e8.segment._4_4_ = 0;
  local_3e8.capTable._0_4_ = 0;
  local_3e8.capTable._4_4_ = 0;
  if (!bVar14) {
    local_3e8.segment._0_4_ = local_608.left;
    local_3e8.segment._4_4_ = local_608._4_4_;
    local_3e8.capTable._0_4_ = local_608.right._0_4_;
    local_3e8.capTable._4_4_ = local_608.right._4_4_;
  }
  local_460 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_3e8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_590,
             (DebugExpression<char_const(&)[4]> *)&local_4c8,(Reader *)&local_460);
  if (kj::_::Debug::minSeverity < 3 && local_568 == false) {
    bVar14 = local_608._36_2_ == 0;
    local_3e8.pointer = (WirePointer *)local_608.op.content.size_;
    if (bVar14) {
      local_3e8.pointer = (WirePointer *)0x0;
    }
    local_3e8.nestingLimit = 0x7fffffff;
    if (!bVar14) {
      local_3e8.nestingLimit = local_5e0;
    }
    local_3e8.segment._0_4_ = 0;
    local_3e8.segment._4_4_ = 0;
    local_3e8.capTable._0_4_ = 0;
    local_3e8.capTable._4_4_ = 0;
    if (!bVar14) {
      local_3e8.segment._0_4_ = local_608.left;
      local_3e8.segment._4_4_ = local_608._4_4_;
      local_3e8.capTable._0_4_ = local_608.right._0_4_;
      local_3e8.capTable._4_4_ = local_608.right._4_4_;
    }
    local_460 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_3e8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[46],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x197,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", _kjCondition, \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_590,
               (char (*) [4])"foo",(Reader *)&local_460);
  }
  local_590._0_4_ = 1;
  local_590._16_8_ = " == ";
  local_590._24_8_ = &DAT_00000005;
  sStack_570 = CONCAT71(sStack_570._1_7_,local_614 == (undefined1  [4])0x1);
  local_590._8_8_ = (CapTableBuilder *)local_614;
  if ((local_614 != (undefined1  [4])0x1) && (kj::_::Debug::minSeverity < 3)) {
    local_3e8.segment._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x198,ERROR,
               "\"failed: expected \" \"(1) == (callCount)\", _kjCondition, 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",
               (DebugComparison<int,_int_&> *)local_590,(int *)&local_3e8,(int *)local_614);
  }
  plVar3 = local_5d0;
  if (local_5d0 != (long *)0x0) {
    local_5d0 = (long *)0x0;
    (**(code **)*local_5d8)(local_5d8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  pRVar7 = local_4d0;
  if (local_4d0 != (RequestHook *)0x0) {
    local_4d0 = (RequestHook *)0x0;
    (*(code *)**(undefined8 **)local_500._40_8_)
              (local_500._40_8_,
               (_func_int *)((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2])
              );
  }
  plVar3 = plStack_550;
  if (plStack_550 != (long *)0x0) {
    plStack_550 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_560._12_4_,local_560._8_4_))
              ((undefined8 *)CONCAT44(local_560._12_4_,local_560._8_4_),
               (long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  RpcSystemBase::~RpcSystemBase(&local_3a8.rpcSystem.super_RpcSystemBase);
  TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_3a8.network);
  pAVar4 = local_5a8;
  if (local_5a8 != (AsyncIoStream *)0x0) {
    local_5a8 = (AsyncIoStream *)0x0;
    (**((local_5b0.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember)
              (local_5b0.ptr,
               (_func_int *)
               ((long)&(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream +
               (long)(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[-2]));
  }
  node = local_610;
  if (local_610 != (undefined1  [8])0x0) {
    local_610 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  plVar3 = local_5b8;
  if (local_5b8 != (long *)0x0) {
    local_5b8 = (long *)0x0;
    (*(code *)**(undefined8 **)local_5c0)(local_5c0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  pAVar10 = pAStack_620;
  if (pAStack_620 != (ArrayDisposer *)0x0) {
    pAStack_620 = (ArrayDisposer *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_628.super_PromiseBase.node.ptr._4_4_,
                         local_628.super_PromiseBase.node.ptr._0_4_))
              ((undefined8 *)
               CONCAT44(local_628.super_PromiseBase.node.ptr._4_4_,
                        local_628.super_PromiseBase.node.ptr._0_4_),
               (_func_int *)
               ((long)&pAVar10->_vptr_ArrayDisposer + (long)pAVar10->_vptr_ArrayDisposer[-2]));
  }
  local_450.super_ErrorHandler._vptr_ErrorHandler = (_func_int **)&PTR_taskFailed_006d1318;
  kj::TaskSet::~TaskSet(&local_450.tasks);
  uVar1 = local_450.traceEncoder.ptr.field_1.value.impl.ptr;
  if ((local_450.traceEncoder.ptr.isSet == true) &&
     (local_450.traceEncoder.ptr.field_1.value.impl.ptr != (Iface *)0x0)) {
    local_450.traceEncoder.ptr.field_1.value.impl.ptr = (Iface *)0x0;
    (**(local_450.traceEncoder.ptr.field_1.value.impl.disposer)->_vptr_Disposer)
              (local_450.traceEncoder.ptr.field_1.value.impl.disposer,
               (_func_int *)
               ((long)&((Iface *)uVar1)->_vptr_Iface + (long)((Iface *)uVar1)->_vptr_Iface[-2]));
  }
  pCVar5 = local_450.bootstrapInterface.hook.ptr;
  if (local_450.bootstrapInterface.hook.ptr != (ClientHook *)0x0) {
    local_450.bootstrapInterface.hook.ptr = (ClientHook *)0x0;
    (**(local_450.bootstrapInterface.hook.disposer)->_vptr_Disposer)
              (local_450.bootstrapInterface.hook.disposer,
               (_func_int *)((long)&pCVar5->_vptr_ClientHook + (long)pCVar5->_vptr_ClientHook[-2]));
  }
  plVar3 = local_518;
  if (local_518 != (long *)0x0) {
    local_518 = (long *)0x0;
    (**(code **)*local_520)(local_520,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_528;
  if (local_528 != (long *)0x0) {
    local_528 = (long *)0x0;
    (**(code **)*local_530)(local_530,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  return;
}

Assistant:

TEST(TwoPartyNetwork, ConvenienceClasses) {
  auto ioContext = kj::setupAsyncIo();

  int callCount = 0;
  TwoPartyServer server(kj::heap<TestInterfaceImpl>(callCount));

  auto address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1").wait(ioContext.waitScope);

  auto listener = address->listen();
  auto listenPromise = server.listen(*listener);

  address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1", listener->getPort()).wait(ioContext.waitScope);

  auto connection = address->connect().wait(ioContext.waitScope);
  TwoPartyClient client(*connection);
  auto cap = client.bootstrap().castAs<test::TestInterface>();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);
  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(ioContext.waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);
}